

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceValidators.cpp
# Opt level: O0

Result * CoreML::validateFeatureDescription
                   (Result *__return_storage_ptr__,FeatureDescription *desc,int modelVersion,
                   bool isInput)

{
  long lVar1;
  int64_t iVar2;
  bool bVar3;
  bool bVar4;
  TypeCase TVar5;
  int iVar6;
  ShapeFlexibilityCase SVar7;
  int iVar8;
  ArrayFeatureType_ArrayDataType AVar9;
  DefaultOptionalValueCase DVar10;
  KeyTypeCase KVar11;
  SizeFlexibilityCase SVar12;
  ImageFeatureType_ColorSpace IVar13;
  TypeCase TVar14;
  string *psVar15;
  ArrayFeatureType *pAVar16;
  ArrayFeatureType_EnumeratedShapes *pAVar17;
  RepeatedPtrField<CoreML::Specification::ArrayFeatureType_Shape> *pRVar18;
  ArrayFeatureType_ShapeRange *this;
  RepeatedPtrField<CoreML::Specification::SizeRange> *this_00;
  long *plVar19;
  uint64 uVar20;
  int64 iVar21;
  DictionaryFeatureType *this_01;
  ImageFeatureType *pIVar22;
  ImageFeatureType_EnumeratedImageSizes *pIVar23;
  ImageFeatureType_ImageSize *pIVar24;
  RepeatedPtrField<CoreML::Specification::ImageFeatureType_ImageSize> *this_02;
  ImageFeatureType_ImageSizeRange *pIVar25;
  uint64 uVar26;
  SequenceFeatureType *pSVar27;
  SizeRange *pSVar28;
  bool local_1071;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ef0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ed0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_eb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e90;
  undefined1 local_e70 [8];
  Result res_2;
  string local_e28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_de8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_dc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_da8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d48;
  string local_d28;
  string local_d08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ce8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cc8;
  string local_ca8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c28;
  string local_c08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_be8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ba8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b88;
  string local_b68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ae8;
  string local_ac8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_aa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9e8;
  Result local_9c8;
  SizeRange *local_9a0;
  SizeRange *heightRange;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_978;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_958;
  undefined1 local_938 [8];
  Result res_1;
  SizeRange *widthRange;
  string local_8e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_888;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_868;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_848;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_828;
  ImageFeatureType_ImageSize *local_808;
  ImageFeatureType_ImageSize *size;
  const_iterator __end5_2;
  const_iterator __begin5_2;
  RepeatedPtrField<CoreML::Specification::ImageFeatureType_ImageSize> *__range5_2;
  undefined1 local_7e0 [7];
  bool foundDefault_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7c0;
  bool local_799;
  uint64 uStack_798;
  bool hasDefault;
  int64_t defaultHeight;
  int64_t defaultWidth;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_768;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_748;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_728;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_708;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_688;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_668;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_648;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_628;
  string local_608;
  string local_5e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a8;
  string local_588;
  string local_568;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_548;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_528;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  int64 local_488;
  long *local_480;
  int64 *value;
  undefined1 local_470 [4];
  int i_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  int local_3ec;
  undefined1 local_3e8 [4];
  int i_1;
  string local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  uint local_2e4;
  string local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  undefined1 local_220 [8];
  Result res;
  SizeRange *range;
  int i;
  RepeatedPtrField<CoreML::Specification::SizeRange> *sizeRanges;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  int local_17c;
  reference pAStack_178;
  int d;
  ArrayFeatureType_Shape *shape_1;
  const_iterator __end5_1;
  const_iterator __begin5_1;
  RepeatedPtrField<CoreML::Specification::ArrayFeatureType_Shape> *__range5_1;
  undefined1 local_150 [7];
  bool foundDefault;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  reference local_110;
  ArrayFeatureType_Shape *shape;
  const_iterator __end5;
  const_iterator __begin5;
  RepeatedPtrField<CoreML::Specification::ArrayFeatureType_Shape> *__range5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  byte local_aa;
  byte local_a9;
  bool hasImplictDefault;
  RepeatedField<long> *pRStack_a8;
  bool hasExplicitDefault;
  RepeatedField<long> *defaultShape;
  FeatureType *type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  allocator<char> local_41;
  string local_40;
  byte local_1d;
  int local_1c;
  bool isInput_local;
  FeatureDescription *pFStack_18;
  int modelVersion_local;
  FeatureDescription *desc_local;
  
  local_1d = isInput;
  local_1c = modelVersion;
  pFStack_18 = desc;
  desc_local = (FeatureDescription *)__return_storage_ptr__;
  psVar15 = Specification::FeatureDescription::name_abi_cxx11_(desc);
  bVar3 = std::operator==(psVar15,"");
  if (bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"Feature description must have a non-empty name.",&local_41);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
  }
  else {
    bVar3 = Specification::FeatureDescription::has_type(pFStack_18);
    if (bVar3) {
      defaultShape = (RepeatedField<long> *)Specification::FeatureDescription::type(pFStack_18);
      TVar5 = Specification::FeatureType::Type_case((FeatureType *)defaultShape);
      switch(TVar5) {
      case TYPE_NOT_SET:
        psVar15 = Specification::FeatureDescription::name_abi_cxx11_(pFStack_18);
        std::operator+(&local_f50,
                       "Feature description has an unspecified or invalid type for feature \'",
                       psVar15);
        std::operator+(&local_f30,&local_f50,"\'.");
        Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_f30);
        std::__cxx11::string::~string((string *)&local_f30);
        std::__cxx11::string::~string((string *)&local_f50);
        return __return_storage_ptr__;
      case kInt64Type:
      case kDoubleType:
      case kStringType:
        break;
      case kImageType:
        pIVar22 = Specification::FeatureType::imagetype((FeatureType *)defaultShape);
        defaultHeight = Specification::ImageFeatureType::width(pIVar22);
        pIVar22 = Specification::FeatureType::imagetype((FeatureType *)defaultShape);
        uStack_798 = Specification::ImageFeatureType::height(pIVar22);
        local_1071 = 0 < defaultHeight && 0 < (long)uStack_798;
        local_799 = local_1071;
        if (2 < local_1c) {
          pIVar22 = Specification::FeatureType::imagetype((FeatureType *)defaultShape);
          SVar12 = Specification::ImageFeatureType::SizeFlexibility_case(pIVar22);
          if (SVar12 == kEnumeratedSizes) {
            pIVar22 = Specification::FeatureType::imagetype((FeatureType *)defaultShape);
            pIVar23 = Specification::ImageFeatureType::enumeratedsizes(pIVar22);
            iVar6 = Specification::ImageFeatureType_EnumeratedImageSizes::sizes_size(pIVar23);
            if (iVar6 == 0) {
              psVar15 = Specification::FeatureDescription::name_abi_cxx11_(pFStack_18);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_7e0,"Description of image feature \'",psVar15);
              std::operator+(&local_7c0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_7e0,"\' has enumerated zero permitted sizes.");
              Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_7c0);
              std::__cxx11::string::~string((string *)&local_7c0);
              std::__cxx11::string::~string((string *)local_7e0);
              return __return_storage_ptr__;
            }
            if ((local_799 & 1U) == 0) {
              pIVar22 = Specification::FeatureType::imagetype((FeatureType *)defaultShape);
              pIVar23 = Specification::ImageFeatureType::enumeratedsizes(pIVar22);
              pIVar24 = Specification::ImageFeatureType_EnumeratedImageSizes::sizes(pIVar23,0);
              defaultHeight = Specification::ImageFeatureType_ImageSize::width(pIVar24);
              pIVar22 = Specification::FeatureType::imagetype((FeatureType *)defaultShape);
              pIVar23 = Specification::ImageFeatureType::enumeratedsizes(pIVar22);
              pIVar24 = Specification::ImageFeatureType_EnumeratedImageSizes::sizes(pIVar23,0);
              uStack_798 = Specification::ImageFeatureType_ImageSize::height(pIVar24);
            }
            else {
              bVar3 = false;
              pIVar22 = Specification::FeatureType::imagetype((FeatureType *)defaultShape);
              pIVar23 = Specification::ImageFeatureType::enumeratedsizes(pIVar22);
              this_02 = Specification::ImageFeatureType_EnumeratedImageSizes::sizes(pIVar23);
              __end5_2 = google::protobuf::
                         RepeatedPtrField<CoreML::Specification::ImageFeatureType_ImageSize>::begin
                                   (this_02);
              size = (ImageFeatureType_ImageSize *)
                     google::protobuf::
                     RepeatedPtrField<CoreML::Specification::ImageFeatureType_ImageSize>::end
                               (this_02);
              while (bVar4 = google::protobuf::internal::
                             RepeatedPtrIterator<const_CoreML::Specification::ImageFeatureType_ImageSize>
                             ::operator!=(&__end5_2,(iterator *)&size), bVar4) {
                local_808 = google::protobuf::internal::
                            RepeatedPtrIterator<const_CoreML::Specification::ImageFeatureType_ImageSize>
                            ::operator*(&__end5_2);
                iVar2 = defaultHeight;
                uVar26 = Specification::ImageFeatureType_ImageSize::width(local_808);
                uVar20 = uStack_798;
                if ((iVar2 == uVar26) &&
                   (uVar26 = Specification::ImageFeatureType_ImageSize::height(local_808),
                   uVar20 == uVar26)) {
                  bVar3 = true;
                  break;
                }
                google::protobuf::internal::
                RepeatedPtrIterator<const_CoreML::Specification::ImageFeatureType_ImageSize>::
                operator++(&__end5_2);
              }
              if (!bVar3) {
                psVar15 = Specification::FeatureDescription::name_abi_cxx11_(pFStack_18);
                std::operator+(&local_8c8,"Description of image feature \'",psVar15);
                std::operator+(&local_8a8,&local_8c8,"\' has a default size of ");
                std::__cxx11::to_string(&local_8e8,defaultHeight);
                std::operator+(&local_888,&local_8a8,&local_8e8);
                std::operator+(&local_868,&local_888,anon_var_dwarf_2db944);
                std::__cxx11::to_string((string *)&widthRange,uStack_798);
                std::operator+(&local_848,&local_868,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &widthRange);
                std::operator+(&local_828,&local_848,
                               " which is not within the allowed enumerated sizes specified.");
                Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_828);
                std::__cxx11::string::~string((string *)&local_828);
                std::__cxx11::string::~string((string *)&local_848);
                std::__cxx11::string::~string((string *)&widthRange);
                std::__cxx11::string::~string((string *)&local_868);
                std::__cxx11::string::~string((string *)&local_888);
                std::__cxx11::string::~string((string *)&local_8e8);
                std::__cxx11::string::~string((string *)&local_8a8);
                std::__cxx11::string::~string((string *)&local_8c8);
                return __return_storage_ptr__;
              }
            }
          }
          else if (SVar12 == kImageSizeRange) {
            pIVar22 = Specification::FeatureType::imagetype((FeatureType *)defaultShape);
            pIVar25 = Specification::ImageFeatureType::imagesizerange(pIVar22);
            res_1.m_message.field_2._8_8_ =
                 Specification::ImageFeatureType_ImageSizeRange::widthrange(pIVar25);
            validateSizeRange((Result *)local_938,(SizeRange *)res_1.m_message.field_2._8_8_);
            bVar3 = Result::good((Result *)local_938);
            if (bVar3) {
              pIVar22 = Specification::FeatureType::imagetype((FeatureType *)defaultShape);
              pIVar25 = Specification::ImageFeatureType::imagesizerange(pIVar22);
              local_9a0 = Specification::ImageFeatureType_ImageSizeRange::heightrange(pIVar25);
              validateSizeRange(&local_9c8,local_9a0);
              Result::operator=((Result *)local_938,&local_9c8);
              Result::~Result(&local_9c8);
              bVar3 = Result::good((Result *)local_938);
              iVar2 = defaultHeight;
              if (bVar3) {
                if ((local_799 & 1U) == 0) {
                  defaultHeight =
                       Specification::SizeRange::lowerbound
                                 ((SizeRange *)res_1.m_message.field_2._8_8_);
                  uStack_798 = Specification::SizeRange::lowerbound(local_9a0);
                  local_2e4 = 0x17;
                }
                else {
                  uVar20 = Specification::SizeRange::lowerbound
                                     ((SizeRange *)res_1.m_message.field_2._8_8_);
                  if ((iVar2 < (long)uVar20) ||
                     ((iVar21 = Specification::SizeRange::upperbound
                                          ((SizeRange *)res_1.m_message.field_2._8_8_),
                      iVar2 = defaultHeight, -1 < iVar21 &&
                      (iVar21 = Specification::SizeRange::upperbound
                                          ((SizeRange *)res_1.m_message.field_2._8_8_),
                      iVar21 < iVar2)))) {
                    psVar15 = Specification::FeatureDescription::name_abi_cxx11_(pFStack_18);
                    std::operator+(&local_aa8,"Description of image feature \'",psVar15);
                    std::operator+(&local_a88,&local_aa8,"\' default width ");
                    std::__cxx11::to_string(&local_ac8,defaultHeight);
                    std::operator+(&local_a68,&local_a88,&local_ac8);
                    std::operator+(&local_a48,&local_a68,
                                   " is not within specified flexible width range");
                    Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_a48);
                    std::__cxx11::string::~string((string *)&local_a48);
                    std::__cxx11::string::~string((string *)&local_a68);
                    std::__cxx11::string::~string((string *)&local_ac8);
                    std::__cxx11::string::~string((string *)&local_a88);
                    std::__cxx11::string::~string((string *)&local_aa8);
                    local_2e4 = 1;
                  }
                  else {
                    uVar20 = uStack_798;
                    uVar26 = Specification::SizeRange::lowerbound(local_9a0);
                    if (((long)uVar20 < (long)uVar26) ||
                       ((iVar21 = Specification::SizeRange::upperbound(local_9a0),
                        uVar20 = uStack_798, -1 < iVar21 &&
                        (iVar21 = Specification::SizeRange::upperbound(local_9a0),
                        iVar21 < (long)uVar20)))) {
                      psVar15 = Specification::FeatureDescription::name_abi_cxx11_(pFStack_18);
                      std::operator+(&local_b48,"Description of image feature \'",psVar15);
                      std::operator+(&local_b28,&local_b48,"\' default height ");
                      std::__cxx11::to_string(&local_b68,uStack_798);
                      std::operator+(&local_b08,&local_b28,&local_b68);
                      std::operator+(&local_ae8,&local_b08,
                                     " is not within specified flexible height range");
                      Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_ae8);
                      std::__cxx11::string::~string((string *)&local_ae8);
                      std::__cxx11::string::~string((string *)&local_b08);
                      std::__cxx11::string::~string((string *)&local_b68);
                      std::__cxx11::string::~string((string *)&local_b28);
                      std::__cxx11::string::~string((string *)&local_b48);
                      local_2e4 = 1;
                    }
                    else {
                      local_2e4 = 0x17;
                    }
                  }
                }
              }
              else {
                psVar15 = Specification::FeatureDescription::name_abi_cxx11_(pFStack_18);
                std::operator+(&local_a28,"Description of image feature \'",psVar15);
                std::operator+(&local_a08,&local_a28,"\' has an invalid flexible height range. ");
                psVar15 = Result::message_abi_cxx11_((Result *)local_938);
                std::operator+(&local_9e8,&local_a08,psVar15);
                Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_9e8);
                std::__cxx11::string::~string((string *)&local_9e8);
                std::__cxx11::string::~string((string *)&local_a08);
                std::__cxx11::string::~string((string *)&local_a28);
                local_2e4 = 1;
              }
            }
            else {
              psVar15 = Specification::FeatureDescription::name_abi_cxx11_(pFStack_18);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &heightRange,"Description of image feature \'",psVar15);
              std::operator+(&local_978,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &heightRange,"\' has an invalid flexible width range. ");
              psVar15 = Result::message_abi_cxx11_((Result *)local_938);
              std::operator+(&local_958,&local_978,psVar15);
              Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_958);
              std::__cxx11::string::~string((string *)&local_958);
              std::__cxx11::string::~string((string *)&local_978);
              std::__cxx11::string::~string((string *)&heightRange);
              local_2e4 = 1;
            }
            Result::~Result((Result *)local_938);
            if (local_2e4 == 1) {
              return __return_storage_ptr__;
            }
          }
        }
        if (defaultHeight < 1) {
          psVar15 = Specification::FeatureDescription::name_abi_cxx11_(pFStack_18);
          std::operator+(&local_be8,"Description of image feature \'",psVar15);
          std::operator+(&local_bc8,&local_be8,"\' has missing or non-positive width ");
          pIVar22 = Specification::FeatureType::imagetype((FeatureType *)defaultShape);
          iVar21 = Specification::ImageFeatureType::width(pIVar22);
          std::__cxx11::to_string(&local_c08,iVar21);
          std::operator+(&local_ba8,&local_bc8,&local_c08);
          std::operator+(&local_b88,&local_ba8,".");
          Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_b88);
          std::__cxx11::string::~string((string *)&local_b88);
          std::__cxx11::string::~string((string *)&local_ba8);
          std::__cxx11::string::~string((string *)&local_c08);
          std::__cxx11::string::~string((string *)&local_bc8);
          std::__cxx11::string::~string((string *)&local_be8);
          return __return_storage_ptr__;
        }
        if ((long)uStack_798 < 1) {
          psVar15 = Specification::FeatureDescription::name_abi_cxx11_(pFStack_18);
          std::operator+(&local_c88,"Description of image feature \'",psVar15);
          std::operator+(&local_c68,&local_c88,"\' has missing or non-positive height ");
          pIVar22 = Specification::FeatureType::imagetype((FeatureType *)defaultShape);
          iVar21 = Specification::ImageFeatureType::height(pIVar22);
          std::__cxx11::to_string(&local_ca8,iVar21);
          std::operator+(&local_c48,&local_c68,&local_ca8);
          std::operator+(&local_c28,&local_c48,".");
          Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_c28);
          std::__cxx11::string::~string((string *)&local_c28);
          std::__cxx11::string::~string((string *)&local_c48);
          std::__cxx11::string::~string((string *)&local_ca8);
          std::__cxx11::string::~string((string *)&local_c68);
          std::__cxx11::string::~string((string *)&local_c88);
          return __return_storage_ptr__;
        }
        pIVar22 = Specification::FeatureType::imagetype((FeatureType *)defaultShape);
        IVar13 = Specification::ImageFeatureType::colorspace(pIVar22);
        switch(IVar13) {
        case ImageFeatureType_ColorSpace_GRAYSCALE:
        case ImageFeatureType_ColorSpace_RGB:
        case ImageFeatureType_ColorSpace_BGR:
          break;
        default:
          psVar15 = Specification::FeatureDescription::name_abi_cxx11_(pFStack_18);
          std::operator+(&local_da8,"Description of image feature \'",psVar15);
          std::operator+(&local_d88,&local_da8,
                         "\' has missing or invalid colorspace. It must be RGB, BGR or GRAYSCALE.");
          Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_d88);
          std::__cxx11::string::~string((string *)&local_d88);
          std::__cxx11::string::~string((string *)&local_da8);
          return __return_storage_ptr__;
        case ImageFeatureType_ColorSpace_GRAYSCALE_FLOAT16:
          if (local_1c < 7) {
            std::__cxx11::to_string(&local_d08,7);
            std::operator+(&local_ce8,&local_d08,". This model has version ");
            std::__cxx11::to_string(&local_d28,local_1c);
            std::operator+(&local_cc8,&local_ce8,&local_d28);
            psVar15 = Specification::FeatureDescription::name_abi_cxx11_(pFStack_18);
            std::operator+(&local_d68,"Description of image feature \'",psVar15);
            std::operator+(&local_d48,&local_d68,
                           "\' has GRAYSCALE_FLOAT16 colorspace, which is only valid in specification version >= "
                          );
            psVar15 = (string *)
                      std::__cxx11::string::operator+=((string *)&local_d48,(string *)&local_cc8);
            Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,psVar15);
            std::__cxx11::string::~string((string *)&local_d48);
            std::__cxx11::string::~string((string *)&local_d68);
            std::__cxx11::string::~string((string *)&local_cc8);
            std::__cxx11::string::~string((string *)&local_d28);
            std::__cxx11::string::~string((string *)&local_ce8);
            std::__cxx11::string::~string((string *)&local_d08);
            return __return_storage_ptr__;
          }
        }
        break;
      case kMultiArrayType:
        pAVar16 = Specification::FeatureType::multiarraytype((FeatureType *)defaultShape);
        pRStack_a8 = Specification::ArrayFeatureType::shape(pAVar16);
        pAVar16 = Specification::FeatureType::multiarraytype((FeatureType *)defaultShape);
        iVar6 = Specification::ArrayFeatureType::shape_size(pAVar16);
        local_a9 = iVar6 != 0;
        local_aa = 0;
        if (2 < local_1c) {
          pAVar16 = Specification::FeatureType::multiarraytype((FeatureType *)defaultShape);
          SVar7 = Specification::ArrayFeatureType::ShapeFlexibility_case(pAVar16);
          if (SVar7 != SHAPEFLEXIBILITY_NOT_SET) {
            if (SVar7 == kEnumeratedShapes) {
              local_aa = 1;
              pAVar16 = Specification::FeatureType::multiarraytype((FeatureType *)defaultShape);
              pAVar17 = Specification::ArrayFeatureType::enumeratedshapes(pAVar16);
              iVar6 = Specification::ArrayFeatureType_EnumeratedShapes::shapes_size(pAVar17);
              if (iVar6 == 0) {
                psVar15 = Specification::FeatureDescription::name_abi_cxx11_(pFStack_18);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &__range5,"Description of multiarray feature \'",psVar15);
                std::operator+(&local_d0,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &__range5,"\' has enumerated zero permitted sizes.");
                Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_d0);
                std::__cxx11::string::~string((string *)&local_d0);
                std::__cxx11::string::~string((string *)&__range5);
                return __return_storage_ptr__;
              }
              pAVar16 = Specification::FeatureType::multiarraytype((FeatureType *)defaultShape);
              pAVar17 = Specification::ArrayFeatureType::enumeratedshapes(pAVar16);
              pRVar18 = Specification::ArrayFeatureType_EnumeratedShapes::shapes(pAVar17);
              __end5 = google::protobuf::
                       RepeatedPtrField<CoreML::Specification::ArrayFeatureType_Shape>::begin
                                 (pRVar18);
              shape = (ArrayFeatureType_Shape *)
                      google::protobuf::
                      RepeatedPtrField<CoreML::Specification::ArrayFeatureType_Shape>::end(pRVar18);
              while (bVar3 = google::protobuf::internal::
                             RepeatedPtrIterator<const_CoreML::Specification::ArrayFeatureType_Shape>
                             ::operator!=(&__end5,(iterator *)&shape), bVar3) {
                local_110 = google::protobuf::internal::
                            RepeatedPtrIterator<const_CoreML::Specification::ArrayFeatureType_Shape>
                            ::operator*(&__end5);
                iVar6 = Specification::ArrayFeatureType_Shape::shape_size(local_110);
                if (iVar6 == 0) {
                  psVar15 = Specification::FeatureDescription::name_abi_cxx11_(pFStack_18);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_150,"Description of multiarray feature \'",psVar15);
                  std::operator+(&local_130,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_150,"\' has enumerated shapes with zero dimensions.");
                  Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_130);
                  std::__cxx11::string::~string((string *)&local_130);
                  std::__cxx11::string::~string((string *)local_150);
                  return __return_storage_ptr__;
                }
                google::protobuf::internal::
                RepeatedPtrIterator<const_CoreML::Specification::ArrayFeatureType_Shape>::operator++
                          (&__end5);
              }
              if ((local_a9 & 1) != 0) {
                bVar3 = false;
                pAVar16 = Specification::FeatureType::multiarraytype((FeatureType *)defaultShape);
                pAVar17 = Specification::ArrayFeatureType::enumeratedshapes(pAVar16);
                pRVar18 = Specification::ArrayFeatureType_EnumeratedShapes::shapes(pAVar17);
                __end5_1 = google::protobuf::
                           RepeatedPtrField<CoreML::Specification::ArrayFeatureType_Shape>::begin
                                     (pRVar18);
                shape_1 = (ArrayFeatureType_Shape *)
                          google::protobuf::
                          RepeatedPtrField<CoreML::Specification::ArrayFeatureType_Shape>::end
                                    (pRVar18);
                while (bVar4 = google::protobuf::internal::
                               RepeatedPtrIterator<const_CoreML::Specification::ArrayFeatureType_Shape>
                               ::operator!=(&__end5_1,(iterator *)&shape_1), bVar4) {
                  pAStack_178 = google::protobuf::internal::
                                RepeatedPtrIterator<const_CoreML::Specification::ArrayFeatureType_Shape>
                                ::operator*(&__end5_1);
                  iVar6 = Specification::ArrayFeatureType_Shape::shape_size(pAStack_178);
                  iVar8 = google::protobuf::RepeatedField<long>::size(pRStack_a8);
                  if (iVar6 == iVar8) {
                    bVar3 = true;
                    for (local_17c = 0; iVar6 = local_17c,
                        iVar8 = Specification::ArrayFeatureType_Shape::shape_size(pAStack_178),
                        iVar6 < iVar8; local_17c = local_17c + 1) {
                      plVar19 = google::protobuf::RepeatedField<long>::operator[]
                                          (pRStack_a8,local_17c);
                      lVar1 = *plVar19;
                      iVar21 = Specification::ArrayFeatureType_Shape::shape(pAStack_178,local_17c);
                      if (lVar1 != iVar21) {
                        bVar3 = false;
                        break;
                      }
                    }
                    if (bVar3) break;
                  }
                  google::protobuf::internal::
                  RepeatedPtrIterator<const_CoreML::Specification::ArrayFeatureType_Shape>::
                  operator++(&__end5_1);
                }
                if (!bVar3) {
                  psVar15 = Specification::FeatureDescription::name_abi_cxx11_(pFStack_18);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&sizeRanges,"Description of multiarray feature \'",psVar15);
                  std::operator+(&local_1c0,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&sizeRanges,"\' has a default shape specified ");
                  std::operator+(&local_1a0,&local_1c0,
                                 " which is not within the allowed enumerated shapes specified.");
                  Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_1a0);
                  std::__cxx11::string::~string((string *)&local_1a0);
                  std::__cxx11::string::~string((string *)&local_1c0);
                  std::__cxx11::string::~string((string *)&sizeRanges);
                  return __return_storage_ptr__;
                }
              }
            }
            else if (SVar7 == kShapeRange) {
              local_aa = 1;
              pAVar16 = Specification::FeatureType::multiarraytype((FeatureType *)defaultShape);
              this = Specification::ArrayFeatureType::shaperange(pAVar16);
              this_00 = Specification::ArrayFeatureType_ShapeRange::sizeranges(this);
              for (range._4_4_ = 0;
                  iVar6 = google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::size
                                    (this_00), range._4_4_ < iVar6; range._4_4_ = range._4_4_ + 1) {
                res.m_message.field_2._8_8_ =
                     google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::
                     operator[](this_00,range._4_4_);
                validateSizeRange((Result *)local_220,(SizeRange *)res.m_message.field_2._8_8_);
                bVar3 = Result::good((Result *)local_220);
                if (!bVar3) {
                  psVar15 = Specification::FeatureDescription::name_abi_cxx11_(pFStack_18);
                  std::operator+(&local_2c0,"Description of multiarray feature \'",psVar15);
                  std::operator+(&local_2a0,&local_2c0,"\' has an invalid range for dimension ");
                  std::__cxx11::to_string(&local_2e0,range._4_4_);
                  std::operator+(&local_280,&local_2a0,&local_2e0);
                  std::operator+(&local_260,&local_280,". ");
                  psVar15 = Result::message_abi_cxx11_((Result *)local_220);
                  std::operator+(&local_240,&local_260,psVar15);
                  Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_240);
                  std::__cxx11::string::~string((string *)&local_240);
                  std::__cxx11::string::~string((string *)&local_260);
                  std::__cxx11::string::~string((string *)&local_280);
                  std::__cxx11::string::~string((string *)&local_2e0);
                  std::__cxx11::string::~string((string *)&local_2a0);
                  std::__cxx11::string::~string((string *)&local_2c0);
                }
                local_2e4 = (uint)!bVar3;
                Result::~Result((Result *)local_220);
                if (local_2e4 != 0) {
                  return __return_storage_ptr__;
                }
              }
              if ((local_a9 & 1) != 0) {
                iVar6 = google::protobuf::RepeatedField<long>::size(pRStack_a8);
                iVar8 = google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::size
                                  (this_00);
                if (iVar6 != iVar8) {
                  psVar15 = Specification::FeatureDescription::name_abi_cxx11_(pFStack_18);
                  std::operator+(&local_3a8,"Description of multiarray feature \'",psVar15);
                  std::operator+(&local_388,&local_3a8,"\' has a default ");
                  iVar6 = google::protobuf::RepeatedField<long>::size(pRStack_a8);
                  std::__cxx11::to_string(&local_3c8,iVar6);
                  std::operator+(&local_368,&local_388,&local_3c8);
                  std::operator+(&local_348,&local_368,"-d shape but a ");
                  iVar6 = google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::size
                                    (this_00);
                  std::__cxx11::to_string((string *)local_3e8,iVar6);
                  std::operator+(&local_328,&local_348,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_3e8);
                  std::operator+(&local_308,&local_328,"-d shape range");
                  Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_308);
                  std::__cxx11::string::~string((string *)&local_308);
                  std::__cxx11::string::~string((string *)&local_328);
                  std::__cxx11::string::~string((string *)local_3e8);
                  std::__cxx11::string::~string((string *)&local_348);
                  std::__cxx11::string::~string((string *)&local_368);
                  std::__cxx11::string::~string((string *)&local_3c8);
                  std::__cxx11::string::~string((string *)&local_388);
                  std::__cxx11::string::~string((string *)&local_3a8);
                  return __return_storage_ptr__;
                }
                for (local_3ec = 0; iVar6 = local_3ec,
                    iVar8 = google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::
                            size(this_00), iVar6 < iVar8; local_3ec = local_3ec + 1) {
                  plVar19 = google::protobuf::RepeatedField<long>::operator[](pRStack_a8,local_3ec);
                  lVar1 = *plVar19;
                  pSVar28 = google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::
                            operator[](this_00,local_3ec);
                  uVar20 = Specification::SizeRange::lowerbound(pSVar28);
                  if (lVar1 < (int)uVar20) {
LAB_003a1ebc:
                    psVar15 = Specification::FeatureDescription::name_abi_cxx11_(pFStack_18);
                    std::operator+(&local_430,"Description of multiarray feature \'",psVar15);
                    std::operator+(&local_410,&local_430,
                                   "\' has a default shape that is out of the specified shape range"
                                  );
                    Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_410);
                    std::__cxx11::string::~string((string *)&local_410);
                    std::__cxx11::string::~string((string *)&local_430);
                    return __return_storage_ptr__;
                  }
                  pSVar28 = google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::
                            operator[](this_00,local_3ec);
                  iVar21 = Specification::SizeRange::upperbound(pSVar28);
                  if (-1 < iVar21) {
                    plVar19 = google::protobuf::RepeatedField<long>::operator[]
                                        (pRStack_a8,local_3ec);
                    lVar1 = *plVar19;
                    pSVar28 = google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::
                              operator[](this_00,local_3ec);
                    iVar21 = Specification::SizeRange::upperbound(pSVar28);
                    if (iVar21 < lVar1) goto LAB_003a1ebc;
                  }
                }
              }
            }
          }
        }
        if ((((local_1d & 1) != 0) && ((local_a9 & 1) == 0)) && ((local_aa & 1) == 0)) {
          psVar15 = Specification::FeatureDescription::name_abi_cxx11_(pFStack_18);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_470,"Description of multiarray feature \'",psVar15);
          std::operator+(&local_450,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_470,"\' has missing shape constraints.");
          Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_450);
          std::__cxx11::string::~string((string *)&local_450);
          std::__cxx11::string::~string((string *)local_470);
          return __return_storage_ptr__;
        }
        if ((local_a9 & 1) != 0) {
          value._4_4_ = 0;
          while( true ) {
            iVar6 = value._4_4_;
            pAVar16 = Specification::FeatureType::multiarraytype((FeatureType *)defaultShape);
            iVar8 = Specification::ArrayFeatureType::shape_size(pAVar16);
            if (iVar8 <= iVar6) break;
            pAVar16 = Specification::FeatureType::multiarraytype((FeatureType *)defaultShape);
            local_488 = Specification::ArrayFeatureType::shape(pAVar16,value._4_4_);
            local_480 = &local_488;
            if (local_488 < 0) {
              psVar15 = Specification::FeatureDescription::name_abi_cxx11_(pFStack_18);
              std::operator+(&local_548,"Description of multiarray feature \'",psVar15);
              std::operator+(&local_528,&local_548,"\' has an invalid shape. Element ");
              std::__cxx11::to_string(&local_568,value._4_4_);
              std::operator+(&local_508,&local_528,&local_568);
              std::operator+(&local_4e8,&local_508," has non-positive value ");
              std::__cxx11::to_string(&local_588,*local_480);
              std::operator+(&local_4c8,&local_4e8,&local_588);
              std::operator+(&local_4a8,&local_4c8,".");
              Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_4a8);
              std::__cxx11::string::~string((string *)&local_4a8);
              std::__cxx11::string::~string((string *)&local_4c8);
              std::__cxx11::string::~string((string *)&local_588);
              std::__cxx11::string::~string((string *)&local_4e8);
              std::__cxx11::string::~string((string *)&local_508);
              std::__cxx11::string::~string((string *)&local_568);
              std::__cxx11::string::~string((string *)&local_528);
              std::__cxx11::string::~string((string *)&local_548);
              return __return_storage_ptr__;
            }
            value._4_4_ = value._4_4_ + 1;
          }
        }
        pAVar16 = Specification::FeatureType::multiarraytype((FeatureType *)defaultShape);
        AVar9 = Specification::ArrayFeatureType::datatype(pAVar16);
        if (AVar9 == ArrayFeatureType_ArrayDataType_FLOAT16) {
          if (local_1c < 7) {
            std::__cxx11::to_string(&local_5e8,7);
            std::operator+(&local_5c8,&local_5e8,". This model has version ");
            std::__cxx11::to_string(&local_608,local_1c);
            std::operator+(&local_5a8,&local_5c8,&local_608);
            psVar15 = Specification::FeatureDescription::name_abi_cxx11_(pFStack_18);
            std::operator+(&local_648,"Description of multiarray feature \'",psVar15);
            std::operator+(&local_628,&local_648,
                           "\' has FLOAT16 dataType, which is only valid in specification version >= "
                          );
            psVar15 = (string *)
                      std::__cxx11::string::operator+=((string *)&local_628,(string *)&local_5a8);
            Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,psVar15);
            std::__cxx11::string::~string((string *)&local_628);
            std::__cxx11::string::~string((string *)&local_648);
            std::__cxx11::string::~string((string *)&local_5a8);
            std::__cxx11::string::~string((string *)&local_608);
            std::__cxx11::string::~string((string *)&local_5c8);
            std::__cxx11::string::~string((string *)&local_5e8);
            return __return_storage_ptr__;
          }
        }
        else if (((AVar9 != ArrayFeatureType_ArrayDataType_FLOAT32) &&
                 (AVar9 != ArrayFeatureType_ArrayDataType_DOUBLE)) &&
                (AVar9 != ArrayFeatureType_ArrayDataType_INT32)) {
          psVar15 = Specification::FeatureDescription::name_abi_cxx11_(pFStack_18);
          std::operator+(&local_688,"Description of multiarray feature \'",psVar15);
          std::operator+(&local_668,&local_688,
                         "\' has an invalid or unspecified dataType. It must be specified as DOUBLE, FLOAT32, FLOAT16 or INT32"
                        );
          Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_668);
          std::__cxx11::string::~string((string *)&local_668);
          std::__cxx11::string::~string((string *)&local_688);
          return __return_storage_ptr__;
        }
        pAVar16 = Specification::FeatureType::multiarraytype((FeatureType *)defaultShape);
        DVar10 = Specification::ArrayFeatureType::defaultOptionalValue_case(pAVar16);
        if (DVar10 == kIntDefaultValue) {
          pAVar16 = Specification::FeatureType::multiarraytype((FeatureType *)defaultShape);
          AVar9 = Specification::ArrayFeatureType::datatype(pAVar16);
          if (AVar9 != ArrayFeatureType_ArrayDataType_INT32) {
            psVar15 = Specification::FeatureDescription::name_abi_cxx11_(pFStack_18);
            std::operator+(&local_748,"Description of multiarray feature \'",psVar15);
            std::operator+(&local_728,&local_748,
                           "\' has mistmatch between dataType and the type of default optional value."
                          );
            Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_728);
            std::__cxx11::string::~string((string *)&local_728);
            std::__cxx11::string::~string((string *)&local_748);
            return __return_storage_ptr__;
          }
        }
        else if (DVar10 == kFloatDefaultValue) {
          pAVar16 = Specification::FeatureType::multiarraytype((FeatureType *)defaultShape);
          AVar9 = Specification::ArrayFeatureType::datatype(pAVar16);
          if (AVar9 != ArrayFeatureType_ArrayDataType_FLOAT32) {
            pAVar16 = Specification::FeatureType::multiarraytype((FeatureType *)defaultShape);
            AVar9 = Specification::ArrayFeatureType::datatype(pAVar16);
            if (AVar9 != ArrayFeatureType_ArrayDataType_FLOAT16) {
              psVar15 = Specification::FeatureDescription::name_abi_cxx11_(pFStack_18);
              std::operator+(&local_708,"Description of multiarray feature \'",psVar15);
              std::operator+(&local_6e8,&local_708,
                             "\' has mistmatch between dataType and the type of default optional value."
                            );
              Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_6e8);
              std::__cxx11::string::~string((string *)&local_6e8);
              std::__cxx11::string::~string((string *)&local_708);
              return __return_storage_ptr__;
            }
          }
        }
        else if (DVar10 == kDoubleDefaultValue) {
          pAVar16 = Specification::FeatureType::multiarraytype((FeatureType *)defaultShape);
          AVar9 = Specification::ArrayFeatureType::datatype(pAVar16);
          if (AVar9 != ArrayFeatureType_ArrayDataType_DOUBLE) {
            psVar15 = Specification::FeatureDescription::name_abi_cxx11_(pFStack_18);
            std::operator+(&local_6c8,"Description of multiarray feature \'",psVar15);
            std::operator+(&local_6a8,&local_6c8,
                           "\' has mistmatch between dataType and the type of default optional value."
                          );
            Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_6a8);
            std::__cxx11::string::~string((string *)&local_6a8);
            std::__cxx11::string::~string((string *)&local_6c8);
            return __return_storage_ptr__;
          }
        }
        break;
      case kDictionaryType:
        this_01 = Specification::FeatureType::dictionarytype((FeatureType *)defaultShape);
        KVar11 = Specification::DictionaryFeatureType::KeyType_case(this_01);
        if (KVar11 == KEYTYPE_NOT_SET) {
          psVar15 = Specification::FeatureDescription::name_abi_cxx11_(pFStack_18);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &defaultWidth,"Description of dictionary feature \'",psVar15);
          std::operator+(&local_768,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &defaultWidth,"\' must contain a key type of either Int64 or String.");
          Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_768);
          std::__cxx11::string::~string((string *)&local_768);
          std::__cxx11::string::~string((string *)&defaultWidth);
          return __return_storage_ptr__;
        }
        break;
      case kSequenceType:
        if (local_1c < 3) {
          std::__cxx11::to_string(&local_e28,3);
          std::operator+(&local_e08,"Sequence types are only valid in specification verison >= ",
                         &local_e28);
          std::operator+(&local_de8,&local_e08,". This model has version ");
          std::__cxx11::to_string((string *)((long)&res_2.m_message.field_2 + 8),local_1c);
          std::operator+(&local_dc8,&local_de8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&res_2.m_message.field_2 + 8));
          Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_dc8);
          std::__cxx11::string::~string((string *)&local_dc8);
          std::__cxx11::string::~string((string *)(res_2.m_message.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)&local_de8);
          std::__cxx11::string::~string((string *)&local_e08);
          std::__cxx11::string::~string((string *)&local_e28);
          return __return_storage_ptr__;
        }
        pSVar27 = Specification::FeatureType::sequencetype((FeatureType *)defaultShape);
        pSVar28 = Specification::SequenceFeatureType::sizerange(pSVar27);
        validateSizeRange((Result *)local_e70,pSVar28);
        bVar3 = Result::good((Result *)local_e70);
        if (bVar3) {
          pSVar27 = Specification::FeatureType::sequencetype((FeatureType *)defaultShape);
          TVar14 = Specification::SequenceFeatureType::Type_case(pSVar27);
          if (TVar14 == TYPE_NOT_SET) {
            psVar15 = Specification::FeatureDescription::name_abi_cxx11_(pFStack_18);
            std::operator+(&local_f10,"Description of sequence feature \'",psVar15);
            std::operator+(&local_ef0,&local_f10,
                           "\' has invalid or missing type. Only Int64 and String sequences are currently supported"
                          );
            Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_ef0);
            std::__cxx11::string::~string((string *)&local_ef0);
            std::__cxx11::string::~string((string *)&local_f10);
            local_2e4 = 1;
          }
          else {
            local_2e4 = 2;
          }
        }
        else {
          psVar15 = Specification::FeatureDescription::name_abi_cxx11_(pFStack_18);
          std::operator+(&local_ed0,"Description of sequence feature \'",psVar15);
          std::operator+(&local_eb0,&local_ed0,"\' has invalid allowed sizes. ");
          psVar15 = Result::message_abi_cxx11_((Result *)local_e70);
          std::operator+(&local_e90,&local_eb0,psVar15);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_e90);
          std::__cxx11::string::~string((string *)&local_e90);
          std::__cxx11::string::~string((string *)&local_eb0);
          std::__cxx11::string::~string((string *)&local_ed0);
          local_2e4 = 1;
        }
        Result::~Result((Result *)local_e70);
        if (local_2e4 == 1) {
          return __return_storage_ptr__;
        }
      }
      Result::Result(__return_storage_ptr__);
    }
    else {
      psVar15 = Specification::FeatureDescription::name_abi_cxx11_(pFStack_18);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&type,
                     "Feature description ",psVar15);
      std::operator+(&local_78,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&type,
                     " must specify a valid feature type.");
      Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&type);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result validateFeatureDescription(const Specification::FeatureDescription& desc, int modelVersion, bool isInput) {
        if (desc.name() == "") {
            return Result(ResultType::INVALID_MODEL_INTERFACE,
                          "Feature description must have a non-empty name.");
        }

        if (!desc.has_type()) {
            return Result(ResultType::INVALID_MODEL_INTERFACE,
                          "Feature description " + desc.name() + " must specify a valid feature type.");
        }

        const auto& type = desc.type();
        switch (type.Type_case()) {
            case Specification::FeatureType::kDoubleType:
            case Specification::FeatureType::kInt64Type:
            case Specification::FeatureType::kStringType:
                // in general, non-parametric types need no further validation
                break;

            case Specification::FeatureType::kMultiArrayType:
            {
                const auto &defaultShape = type.multiarraytype().shape();
                bool hasExplicitDefault = (type.multiarraytype().shape_size() != 0);
                bool hasImplictDefault = false;
                // Newer versions use the updated shape constraints for images and multi-arrays
                if (modelVersion >= MLMODEL_SPECIFICATION_VERSION_IOS12) {

                    switch (type.multiarraytype().ShapeFlexibility_case()) {

                        case Specification::ArrayFeatureType::kEnumeratedShapes: {

                            hasImplictDefault = true;

                            if (type.multiarraytype().enumeratedshapes().shapes_size() == 0) {
                                return Result(ResultType::INVALID_MODEL_INTERFACE,
                                              "Description of multiarray feature '" + desc.name() + "' has enumerated zero permitted sizes.");
                            }

                            for (auto &shape : type.multiarraytype().enumeratedshapes().shapes()) {
                                if (shape.shape_size() == 0) {
                                    return Result(ResultType::INVALID_MODEL_INTERFACE,
                                                  "Description of multiarray feature '" + desc.name() + "' has enumerated shapes with zero dimensions.");
                                }
                            }

                            if (!hasExplicitDefault) {
                                break;
                            }

                            bool foundDefault = false;
                            for (auto &shape : type.multiarraytype().enumeratedshapes().shapes()) {
                                if (shape.shape_size() != defaultShape.size()) { continue; }
                                foundDefault = true;
                                for (int d = 0; d < shape.shape_size(); d++) {
                                    if (defaultShape[d] != shape.shape(d)) { foundDefault = false; break; }
                                }
                                if (foundDefault) { break; }
                            }

                            if (!foundDefault) {
                                return Result(ResultType::INVALID_MODEL_INTERFACE,
                                              "Description of multiarray feature '" + desc.name() + "' has a default shape specified " +
                                              " which is not within the allowed enumerated shapes specified.");
                            }

                            break;
                        }
                        case Specification::ArrayFeatureType::kShapeRange: {

                            hasImplictDefault = true;

                            const auto& sizeRanges = type.multiarraytype().shaperange().sizeranges();
                            for (int i = 0; i < sizeRanges.size(); i++) {
                                const auto &range = sizeRanges[i];
                                Result res = validateSizeRange(range);
                                if (!res.good()) {
                                    return Result(ResultType::INVALID_MODEL_INTERFACE,
                                                  "Description of multiarray feature '" + desc.name() +
                                                  "' has an invalid range for dimension " + std::to_string(i) + ". " +
                                                  res.message());
                                }
                            }

                            if (!hasExplicitDefault) {
                                break;
                            }

                            // Check if default is compatible
                            if (defaultShape.size() != sizeRanges.size()) {
                                return Result(ResultType::INVALID_MODEL_INTERFACE,
                                              "Description of multiarray feature '" + desc.name() +
                                              "' has a default " + std::to_string(defaultShape.size()) + "-d shape but a " +
                                              std::to_string(sizeRanges.size()) + "-d shape range");
                            }

                             for (int i = 0; i < sizeRanges.size(); i++) {
                                 if (defaultShape[i] < (int)sizeRanges[i].lowerbound() ||
                                     (sizeRanges[i].upperbound() >= 0 && defaultShape[i] > sizeRanges[i].upperbound())) {

                                     return Result(ResultType::INVALID_MODEL_INTERFACE,
                                                   "Description of multiarray feature '" + desc.name() +
                                                   "' has a default shape that is out of the specified shape range");
                                 }
                             }

                            break;
                        }
                        case Specification::ArrayFeatureType::SHAPEFLEXIBILITY_NOT_SET:
                            break;
                    }

                }

                if (isInput && !hasExplicitDefault && !hasImplictDefault) {
                    return Result(ResultType::INVALID_MODEL_INTERFACE,
                                  "Description of multiarray feature '" + desc.name() + "' has missing shape constraints.");
                }

                if (hasExplicitDefault) {
                    for (int i=0; i < type.multiarraytype().shape_size(); i++) {
                        const auto &value = type.multiarraytype().shape(i);
                        if (value < 0) {
                            return Result(ResultType::INVALID_MODEL_INTERFACE,
                                          "Description of multiarray feature '" + desc.name() + "' has an invalid shape. "
                                          "Element " + std::to_string(i) + " has non-positive value " + std::to_string(value) + ".");
                        }
                    }
                }

                switch (type.multiarraytype().datatype()) {
                    case Specification::ArrayFeatureType_ArrayDataType_DOUBLE:
                    case Specification::ArrayFeatureType_ArrayDataType_FLOAT32:
                    case Specification::ArrayFeatureType_ArrayDataType_INT32:
                        break;
                    case Specification::ArrayFeatureType_ArrayDataType_FLOAT16:
                        if (modelVersion < MLMODEL_SPECIFICATION_VERSION_IOS16) {
                            return Result(ResultType::INVALID_MODEL_INTERFACE,
                                          "Description of multiarray feature '" + desc.name() +
                                          "' has FLOAT16 dataType, which is only valid in specification version >= " += std::to_string(MLMODEL_SPECIFICATION_VERSION_IOS16)+
                                          ". This model has version " + std::to_string(modelVersion));
                        }

                        break;
                    default:
                        return Result(ResultType::INVALID_MODEL_INTERFACE,
                                      "Description of multiarray feature '" + desc.name() + "' has an invalid or unspecified dataType. "
                                      "It must be specified as DOUBLE, FLOAT32, FLOAT16 or INT32");
                }

                switch (type.multiarraytype().defaultOptionalValue_case()) {
                    case CoreML::Specification::ArrayFeatureType::kDoubleDefaultValue:
                        if (type.multiarraytype().datatype() != Specification::ArrayFeatureType_ArrayDataType_DOUBLE){
                            return Result(ResultType::INVALID_MODEL_INTERFACE,
                                          "Description of multiarray feature '" + desc.name() + "' has mistmatch"
                                          " between dataType and the type of default optional value.");
                        }
                        break;
                    case CoreML::Specification::ArrayFeatureType::kFloatDefaultValue:
                        if (type.multiarraytype().datatype() != Specification::ArrayFeatureType_ArrayDataType_FLOAT32 &&
                            type.multiarraytype().datatype() != Specification::ArrayFeatureType_ArrayDataType_FLOAT16){
                            return Result(ResultType::INVALID_MODEL_INTERFACE,
                                          "Description of multiarray feature '" + desc.name() + "' has mistmatch"
                                          " between dataType and the type of default optional value.");
                        }
                        break;
                    case CoreML::Specification::ArrayFeatureType::kIntDefaultValue:
                        if (type.multiarraytype().datatype() != Specification::ArrayFeatureType_ArrayDataType_INT32){
                            return Result(ResultType::INVALID_MODEL_INTERFACE,
                                          "Description of multiarray feature '" + desc.name() + "' has mistmatch"
                                          " between dataType and the type of default optional value.");
                        }
                        break;
                    default:
                        break;
                }
                
                break;

            }
            case Specification::FeatureType::kDictionaryType:
                switch (type.dictionarytype().KeyType_case()) {
                    case Specification::DictionaryFeatureType::KeyTypeCase::kInt64KeyType:
                    case Specification::DictionaryFeatureType::KeyTypeCase::kStringKeyType:
                        break;
                    case Specification::DictionaryFeatureType::KeyTypeCase::KEYTYPE_NOT_SET:
                        return Result(ResultType::INVALID_MODEL_INTERFACE,
                                      "Description of dictionary feature '" + desc.name() + "' must contain a key type of either Int64 or String.");
                }
                break;

            case Specification::FeatureType::kImageType: {

                int64_t defaultWidth = type.imagetype().width();
                int64_t defaultHeight = type.imagetype().height();
                bool hasDefault = (defaultWidth > 0 && defaultHeight > 0);

                if (modelVersion >= MLMODEL_SPECIFICATION_VERSION_IOS12) {

                    switch (type.imagetype().SizeFlexibility_case()) {

                        case Specification::ImageFeatureType::kEnumeratedSizes: {

                            if (type.imagetype().enumeratedsizes().sizes_size() == 0) {
                                return Result(ResultType::INVALID_MODEL_INTERFACE,
                                              "Description of image feature '" + desc.name() + "' has enumerated zero permitted sizes.");
                            }

                            if (!hasDefault) {
                                defaultWidth = (int64_t)type.imagetype().enumeratedsizes().sizes(0).width();
                                defaultHeight = (int64_t)type.imagetype().enumeratedsizes().sizes(0).height();
                                break;
                            }

                            bool foundDefault = false;
                            for (auto &size : type.imagetype().enumeratedsizes().sizes()) {
                                if (defaultWidth == (int64_t)size.width() && defaultHeight == (int64_t)size.height()) {
                                    foundDefault = true;
                                    break;
                                }
                            }

                            if (!foundDefault) {
                                return Result(ResultType::INVALID_MODEL_INTERFACE,
                                              "Description of image feature '" + desc.name() + "' has a default size of " +
                                              std::to_string(defaultWidth) + " × " + std::to_string(defaultHeight) +
                                              " which is not within the allowed enumerated sizes specified.");
                            }

                            break;
                        }
                        case Specification::ImageFeatureType::kImageSizeRange:
                        {
                            const auto& widthRange = type.imagetype().imagesizerange().widthrange();
                            Result res = validateSizeRange(widthRange);
                            if (!res.good()) {
                                return Result(ResultType::INVALID_MODEL_INTERFACE,
                                              "Description of image feature '" + desc.name() + "' has an invalid flexible width range. "
                                               + res.message());
                            }

                            const auto& heightRange = type.imagetype().imagesizerange().heightrange();
                            res = validateSizeRange(heightRange);
                            if (!res.good()) {
                                return Result(ResultType::INVALID_MODEL_INTERFACE,
                                              "Description of image feature '" + desc.name() + "' has an invalid flexible height range. "
                                              + res.message());
                            }

                            if (!hasDefault) {
                                defaultWidth = (int64_t)widthRange.lowerbound();
                                defaultHeight = (int64_t)heightRange.lowerbound();
                                break;
                            }

                            if (defaultWidth < (int64_t)widthRange.lowerbound() ||
                                (widthRange.upperbound() >=0 && defaultWidth > widthRange.upperbound())) {
                                return Result(ResultType::INVALID_MODEL_INTERFACE,
                                              "Description of image feature '" + desc.name() + "' default width "
                                              + std::to_string(defaultWidth) + " is not within specified flexible width range");
                            }

                            if (defaultHeight < (int64_t)heightRange.lowerbound() ||
                                (heightRange.upperbound() >=0 && defaultHeight > heightRange.upperbound())) {
                                return Result(ResultType::INVALID_MODEL_INTERFACE,
                                              "Description of image feature '" + desc.name() + "' default height "
                                              + std::to_string(defaultHeight) + " is not within specified flexible height range");
                            }


                            break;
                        }
                        default:
                            break;
                    }

                }

                if (defaultWidth <= 0) {
                    return Result(ResultType::INVALID_MODEL_INTERFACE,
                                  "Description of image feature '" + desc.name() +
                                  "' has missing or non-positive width " + std::to_string(type.imagetype().width()) + ".");
                }

                if (defaultHeight <= 0) {
                    return Result(ResultType::INVALID_MODEL_INTERFACE,
                                  "Description of image feature '" + desc.name() +
                                  "' has missing or non-positive height " + std::to_string(type.imagetype().height()) + ".");
                }

                switch (type.imagetype().colorspace()) {
                    case Specification::ImageFeatureType_ColorSpace_GRAYSCALE:
                    case Specification::ImageFeatureType_ColorSpace_RGB:
                    case Specification::ImageFeatureType_ColorSpace_BGR:
                        break;
                    case Specification::ImageFeatureType_ColorSpace_GRAYSCALE_FLOAT16:
                        if (modelVersion < MLMODEL_SPECIFICATION_VERSION_IOS16) {
                            return Result(ResultType::INVALID_MODEL_INTERFACE,
                                          "Description of image feature '" + desc.name() +
                                          "' has GRAYSCALE_FLOAT16 colorspace, which is only valid in specification version >= " += std::to_string(MLMODEL_SPECIFICATION_VERSION_IOS16)+
                                          ". This model has version " + std::to_string(modelVersion));
                        }
                        break;
                    default:
                        return Result(ResultType::INVALID_MODEL_INTERFACE,
                                      "Description of image feature '" + desc.name() +
                                      "' has missing or invalid colorspace. It must be RGB, BGR or GRAYSCALE.");
                }
                break;
            }
            case Specification::FeatureType::kSequenceType: {

                if (modelVersion < MLMODEL_SPECIFICATION_VERSION_IOS12) {
                    return  Result(ResultType::INVALID_MODEL_INTERFACE,
                                   "Sequence types are only valid in specification verison >= " + std::to_string(MLMODEL_SPECIFICATION_VERSION_IOS12)+
                                   ". This model has version " + std::to_string(modelVersion));
                }

                // Validate size
                Result res = validateSizeRange(type.sequencetype().sizerange());
                if (!res.good()) {
                    return Result(ResultType::INVALID_MODEL_INTERFACE,
                                  "Description of sequence feature '" + desc.name() + "' has invalid allowed sizes. "
                                  + res.message());
                }

                // Validate type

                switch (type.sequencetype().Type_case()) {
                    case Specification::SequenceFeatureType::kInt64Type:
                    case Specification::SequenceFeatureType::kStringType:
                        break;
                    case Specification::SequenceFeatureType::TYPE_NOT_SET:
                        return Result(ResultType::INVALID_MODEL_INTERFACE,
                                      "Description of sequence feature '" + desc.name() + "' has invalid or missing type. "
                                      "Only Int64 and String sequences are currently supported");


                }
                break;
            }
            case Specification::FeatureType::TYPE_NOT_SET:
                // these aren't equal to anything, even themselves
                return Result(ResultType::INVALID_MODEL_INTERFACE,
                              "Feature description has an unspecified or invalid type for feature '" + desc.name() + "'.");
        }

        // If we got here, the feature description is valid.
        return Result();
    }